

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-abandon.c
# Opt level: O2

_Bool mi_arena_segment_os_clear_abandoned(mi_segment_t *segment,_Bool take_lock)

{
  mi_subproc_t *pmVar1;
  mi_segment_t *pmVar2;
  mi_segment_s *pmVar3;
  _Bool _Var4;
  mi_threadid_t mVar5;
  mi_segment_t **ppmVar6;
  undefined7 in_register_00000031;
  mi_segment_s **ppmVar7;
  
  pmVar1 = segment->subproc;
  if (((int)CONCAT71(in_register_00000031,take_lock) != 0) &&
     (_Var4 = mi_lock_try_acquire(&pmVar1->abandoned_os_lock), !_Var4)) {
    return false;
  }
  pmVar2 = segment->abandoned_os_next;
  pmVar3 = segment->abandoned_os_prev;
  if (pmVar2 == (mi_segment_t *)0x0 && pmVar3 == (mi_segment_s *)0x0) {
    if (pmVar1->abandoned_os_list != segment) {
      _Var4 = false;
      if (!take_lock) {
        return false;
      }
      goto LAB_003f92c3;
    }
LAB_003f927a:
    ppmVar6 = &pmVar1->abandoned_os_list;
  }
  else {
    if (pmVar3 == (mi_segment_s *)0x0) goto LAB_003f927a;
    ppmVar6 = &pmVar3->abandoned_os_next;
  }
  *ppmVar6 = pmVar2;
  ppmVar7 = &pmVar2->abandoned_os_prev;
  if (pmVar2 == (mi_segment_t *)0x0) {
    ppmVar7 = &pmVar1->abandoned_os_list_tail;
  }
  *ppmVar7 = pmVar3;
  segment->abandoned_os_next = (mi_segment_s *)0x0;
  segment->abandoned_os_prev = (mi_segment_s *)0x0;
  LOCK();
  pmVar1->abandoned_count = pmVar1->abandoned_count - 1;
  UNLOCK();
  LOCK();
  pmVar1->abandoned_os_list_count = pmVar1->abandoned_os_list_count - 1;
  UNLOCK();
  if (!take_lock) {
    return true;
  }
  mVar5 = _mi_thread_id();
  segment->thread_id = mVar5;
  _Var4 = true;
LAB_003f92c3:
  pthread_mutex_unlock((pthread_mutex_t *)&segment->subproc->abandoned_os_lock);
  return _Var4;
}

Assistant:

static bool mi_arena_segment_os_clear_abandoned(mi_segment_t* segment, bool take_lock) {
  mi_assert(segment->memid.memkind != MI_MEM_ARENA);
  // not in an arena, remove from list of abandoned os segments
  mi_subproc_t* const subproc = segment->subproc;
  if (take_lock && !mi_lock_try_acquire(&subproc->abandoned_os_lock)) {
    return false;  // failed to acquire the lock, we just give up
  }
  // remove atomically from the abandoned os list (if possible!)
  bool reclaimed = false;
  mi_segment_t* const next = segment->abandoned_os_next;
  mi_segment_t* const prev = segment->abandoned_os_prev;
  if (next != NULL || prev != NULL || subproc->abandoned_os_list == segment) {
    #if MI_DEBUG>3
    // find ourselves in the abandoned list (and check the count)
    bool found = false;
    size_t count = 0;
    for (mi_segment_t* current = subproc->abandoned_os_list; current != NULL; current = current->abandoned_os_next) {
      if (current == segment) { found = true; }
      count++;
    }
    mi_assert_internal(found);
    mi_assert_internal(count == mi_atomic_load_relaxed(&subproc->abandoned_os_list_count));
    #endif
    // remove (atomically) from the list and reclaim
    if (prev != NULL) { prev->abandoned_os_next = next; }
    else { subproc->abandoned_os_list = next; }
    if (next != NULL) { next->abandoned_os_prev = prev; }
    else { subproc->abandoned_os_list_tail = prev; }
    segment->abandoned_os_next = NULL;
    segment->abandoned_os_prev = NULL;
    mi_atomic_decrement_relaxed(&subproc->abandoned_count);
    mi_atomic_decrement_relaxed(&subproc->abandoned_os_list_count);
    if (take_lock) { // don't reset the thread_id when iterating
      mi_atomic_store_release(&segment->thread_id, _mi_thread_id());
    }
    reclaimed = true;
  }
  if (take_lock) { mi_lock_release(&segment->subproc->abandoned_os_lock); }
  return reclaimed;
}